

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O2

Texture * TextureImage::Texture::loadTexture(string *_name,string *_filename)

{
  bool bVar1;
  __type _Var2;
  GLenum GVar3;
  GLubyte *pGVar4;
  ostream *poVar5;
  FILE *__stream;
  Texture *pTVar6;
  stbi_uc *retval_from_stbi_load;
  undefined8 uVar7;
  undefined8 uVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>_>,_bool>
  pVar9;
  int channels;
  int height;
  int width;
  Texture *local_50;
  string local_48;
  
  GVar3 = glGetError();
  if (GVar3 != 0) {
    pGVar4 = glewGetErrorString(GVar3);
    poVar5 = std::operator<<((ostream *)&std::cout,"ERROR before loadTexture():");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,(char *)pGVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)_name);
  poVar5 = std::operator<<(poVar5,"<>");
  poVar5 = std::operator<<(poVar5,(string *)_filename);
  std::endl<char,std::char_traits<char>>(poVar5);
  if ((_filename->_M_string_length == 0) || (bVar1 = std::operator==(_filename,""), bVar1)) {
    std::__cxx11::string::string((string *)&local_48,(string *)_name);
    testAllSuffix((string *)&width,&local_48);
    std::__cxx11::string::operator=((string *)_filename,(string *)&width);
    std::__cxx11::string::~string((string *)&width);
    std::__cxx11::string::~string((string *)&local_48);
    if (_filename->_M_string_length == 0) goto LAB_00127db8;
  }
  __stream = fopen((_filename->_M_dataplus)._M_p,"r");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    pTVar6 = (Texture *)operator_new(0x60);
    Texture(pTVar6);
    std::__cxx11::string::string((string *)&width,(string *)_name);
    local_50 = pTVar6;
    pVar9 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TextureImage::Texture*>,std::_Select1st<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TextureImage::Texture*>,std::_Select1st<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>>
                        *)allTexture_abi_cxx11_,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>
                        *)&width);
    std::__cxx11::string::~string((string *)&width);
    pTVar6 = *(Texture **)(pVar9.first._M_node._M_node + 2);
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      _Var2 = std::operator==(&pTVar6->filename,_filename);
      if ((_Var2) && (pTVar6->available != false)) {
        return pTVar6;
      }
      clear(pTVar6);
    }
    std::__cxx11::string::_M_assign((string *)&pTVar6->name);
    std::__cxx11::string::_M_assign((string *)&pTVar6->filename);
    stbi_set_flip_vertically_on_load(1);
    retval_from_stbi_load = stbi_load((_filename->_M_dataplus)._M_p,&width,&height,&channels,0);
    if (retval_from_stbi_load == (stbi_uc *)0x0) {
      return (Texture *)error;
    }
    uVar7 = 0x2002;
    if (channels != 1) {
      uVar7 = 0x1908;
    }
    uVar8 = 0x8227;
    if (channels != 2) {
      uVar8 = uVar7;
    }
    uVar7 = 0x1907;
    if (channels != 3) {
      uVar7 = uVar8;
    }
    glGenTextures(1,&pTVar6->tex);
    glBindTexture(0xde1,pTVar6->tex);
    glTexParameteri(0xde1,0x2802,0x2901);
    glTexParameteri(0xde1,0x2803,0x2901);
    glTexParameteri(0xde1,0x2800,0x2601);
    glTexParameteri(0xde1,0x2801,0x2601);
    glTexImage2D(0xde1,0,0x1908,pTVar6->width,pTVar6->height,0,uVar7,0x1401,retval_from_stbi_load);
    (*__glewGenerateMipmap)(0xde1);
    glBindTexture(0xde1,0);
    stbi_image_free(retval_from_stbi_load);
    GVar3 = glGetError();
    if (GVar3 != 0) {
      pGVar4 = glewGetErrorString(GVar3);
      poVar5 = std::operator<<((ostream *)&std::cout,"ERROR in loadTexture():");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,(char *)pGVar4);
      std::endl<char,std::char_traits<char>>(poVar5);
      return (Texture *)error;
    }
    pTVar6->available = true;
    return pTVar6;
  }
LAB_00127db8:
  return (Texture *)error;
}

Assistant:

static Texture &loadTexture(std::string _name, std::string _filename = std::string()) {
            GLenum gl_error_code = GL_NO_ERROR;
            if ((gl_error_code = glGetError()) != GL_NO_ERROR) {
                const GLubyte *errString = glewGetErrorString(gl_error_code);
                std::cout << "ERROR before loadTexture():" << std::endl;
                std::cout << errString << std::endl;
            }
            std::cout << _name << "<>" << _filename << std::endl;
            if (_filename.empty() || _filename == "") {
                _filename = testAllSuffix(_name);
                if (_filename.empty()) return error;
            }
            FILE *fi = fopen(_filename.c_str(), "r");
            if (fi == NULL) return error;
            fclose(fi);

            std::pair<Name2Texture::iterator, bool> insertion =
                    allTexture.insert(Name2Texture::value_type(_name, new Texture()));
            Texture &target = *(insertion.first->second);
            if (!insertion.second) {
                if (target.filename == _filename && target.available) {
                    return target;
                } else {
                    target.clear();
                }
            }

            target.name = _name;
            target.filename = _filename;

            stbi_set_flip_vertically_on_load(true);
            int width, height, channels;
            unsigned char *data =
                    stbi_load(_filename.c_str(), &width, &height, &channels, 0);
            if (!data) {
                return error;
            }

            GLenum format = GL_RGBA;
            if (channels == 1) {
                format = GL_R;
            }
            if (channels == 2) {
                format = GL_RG;
            }
            if (channels == 3) {
                format = GL_RGB;
            }

            glGenTextures(1, &target.tex);
            glBindTexture(GL_TEXTURE_2D, target.tex);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, target.width, target.height,
                         0, format, GL_UNSIGNED_BYTE, data);
            glGenerateMipmap(GL_TEXTURE_2D);
            glBindTexture(GL_TEXTURE_2D, 0);

            stbi_image_free(data);

            if ((gl_error_code = glGetError()) != GL_NO_ERROR) {
                const GLubyte *errString = glewGetErrorString(gl_error_code);
                std::cout << "ERROR in loadTexture():" << std::endl;
                std::cout << errString << std::endl;
                return error;
            }

            target.available = true;
            return target;
        }